

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpPrepass::OnReloc
          (BinaryReaderObjdumpPrepass *this,RelocType type,Offset offset,Index index,uint32_t addend
          )

{
  uint32_t local_30;
  Index local_2c;
  uint32_t addend_local;
  Index index_local;
  Offset offset_local;
  BinaryReaderObjdumpPrepass *pBStack_18;
  RelocType type_local;
  BinaryReaderObjdumpPrepass *this_local;
  
  local_30 = addend;
  local_2c = index;
  _addend_local = offset;
  offset_local._4_4_ = type;
  pBStack_18 = this;
  BinaryReaderNop::OnReloc((BinaryReaderNop *)this,type,offset,index,addend);
  if ((this->super_BinaryReaderObjdumpBase).reloc_section_ == Code) {
    std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
    emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&,unsigned_int&>
              ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
               (this->super_BinaryReaderObjdumpBase).objdump_state_,
               (RelocType *)((long)&offset_local + 4),(unsigned_long *)&addend_local,&local_2c,
               &local_30);
  }
  else if ((this->super_BinaryReaderObjdumpBase).reloc_section_ == Data) {
    std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
    emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&,unsigned_int&>
              ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
               &((this->super_BinaryReaderObjdumpBase).objdump_state_)->data_relocations,
               (RelocType *)((long)&offset_local + 4),(unsigned_long *)&addend_local,&local_2c,
               &local_30);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpPrepass::OnReloc(RelocType type,
                                           Offset offset,
                                           Index index,
                                           uint32_t addend) {
  BinaryReaderObjdumpBase::OnReloc(type, offset, index, addend);
  if (reloc_section_ == BinarySection::Code) {
    objdump_state_->code_relocations.emplace_back(type, offset, index, addend);
  } else if (reloc_section_ == BinarySection::Data) {
    objdump_state_->data_relocations.emplace_back(type, offset, index, addend);
  }
  return Result::Ok;
}